

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFilteringTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::TextureCubeFilteringCase::iterate(TextureCubeFilteringCase *this)

{
  size_type *psVar1;
  TextureFormat TVar2;
  ulong uVar3;
  size_t *psVar4;
  Vec4 *pVVar5;
  ostringstream *poVar6;
  deUint32 dVar7;
  TestLog *log;
  pointer pFVar8;
  RenderContext *context;
  TextureCube *pTVar9;
  ConstPixelBufferAccess *pCVar10;
  pointer pFVar11;
  ConstPixelBufferAccess *pCVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  bool bVar15;
  int iVar16;
  deUint32 dVar17;
  SamplerType SVar18;
  undefined4 extraout_EAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 *puVar20;
  TextureFormat *pTVar21;
  undefined4 extraout_var_01;
  NotSupportedError *this_00;
  byte bVar22;
  char *description;
  qpTestResult testResult;
  ulong uVar23;
  pointer pfVar24;
  TestContext *pTVar25;
  uint uVar26;
  void *pvVar27;
  int iVar28;
  TextureCube *format;
  CubeFace face;
  undefined1 auVar29 [16];
  Surface result;
  RandomViewport viewport;
  vector<float,_std::allocator<float>_> texCoord;
  LookupPrecision local_348;
  LodPrecision local_314;
  int *local_308;
  long local_300;
  undefined1 local_2f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  ScopedLogSection iterSection;
  PixelFormat pixelFormat;
  TextureFormatInfo fmtInfo;
  undefined1 local_260 [76];
  ConstPixelBufferAccess *pCStack_214;
  ConstPixelBufferAccess *local_20c;
  ConstPixelBufferAccess *pCStack_204;
  int local_1fc;
  bool local_1e8;
  undefined7 uStack_1e7;
  LodMode local_1e0;
  undefined1 local_1c8 [16];
  ConstPixelBufferAccess *local_1b8;
  ConstPixelBufferAccess *pCStack_1b0;
  int local_1a8;
  anon_union_16_3_1194ccdc_for_v aStack_1a4;
  undefined4 uStack_194;
  DepthStencilMode DStack_190;
  ios_base local_158 [8];
  ios_base local_150 [264];
  IVec4 colorBits;
  long lVar19;
  
  iVar16 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar19 = CONCAT44(extraout_var,iVar16);
  iVar16 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  dVar17 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  uVar26 = ((uint)this->m_caseNdx >> 0x10 ^ this->m_caseNdx ^ 0x3d) * 9;
  uVar26 = (uVar26 >> 4 ^ uVar26) * 0x27d4eb2d;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var_00,iVar16),0x1c,0x1c,
             uVar26 >> 0xf ^ dVar17 ^ uVar26);
  log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  pVVar5 = &fmtInfo.valueMax;
  fmtInfo.valueMin.m_data._0_8_ = pVVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&fmtInfo,"Test","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::ostream::operator<<(local_1c8,this->m_caseNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  uVar3 = CONCAT44(local_348.uvwBits.m_data[0],local_348.coordBits.m_data[2]) +
          fmtInfo.valueMin.m_data._8_8_;
  uVar23 = 0xf;
  if ((Vec4 *)fmtInfo.valueMin.m_data._0_8_ != pVVar5) {
    uVar23 = fmtInfo.valueMax.m_data._0_8_;
  }
  if (uVar23 < uVar3) {
    uVar23 = 0xf;
    if ((int *)local_348.coordBits.m_data._0_8_ != local_348.uvwBits.m_data + 1) {
      uVar23 = CONCAT44(local_348.uvwBits.m_data[2],local_348.uvwBits.m_data[1]);
    }
    if (uVar23 < uVar3) goto LAB_00508695;
    puVar20 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_348,0,(char *)0x0,fmtInfo.valueMin.m_data._0_8_);
  }
  else {
LAB_00508695:
    puVar20 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&fmtInfo,local_348.coordBits.m_data._0_8_);
  }
  local_260._0_8_ = local_260 + 0x10;
  psVar1 = puVar20 + 2;
  if ((size_type *)*puVar20 == psVar1) {
    local_260._16_8_ = *psVar1;
    local_260._24_8_ = puVar20[3];
  }
  else {
    local_260._16_8_ = *psVar1;
    local_260._0_8_ = (size_type *)*puVar20;
  }
  local_260._8_8_ = puVar20[1];
  *puVar20 = psVar1;
  puVar20[1] = 0;
  *(undefined1 *)psVar1 = 0;
  psVar4 = &result.m_pixels.m_cap;
  result._0_8_ = psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&result,"Test ","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::ostream::operator<<(local_1c8,this->m_caseNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  pfVar24 = (pointer)0xf;
  if ((size_t *)result._0_8_ != psVar4) {
    pfVar24 = (pointer)result.m_pixels.m_cap;
  }
  if (pfVar24 < (pointer)((long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish + (long)result.m_pixels.m_ptr)) {
    pfVar24 = (pointer)0xf;
    if ((pointer *)
        texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage) {
      pfVar24 = texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    }
    if ((pointer)((long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish + (long)result.m_pixels.m_ptr) <= pfVar24)
    {
      pTVar21 = (TextureFormat *)
                std::__cxx11::string::replace((ulong)&texCoord,0,(char *)0x0,result._0_8_);
      goto LAB_005087e1;
    }
  }
  pTVar21 = (TextureFormat *)
            std::__cxx11::string::_M_append
                      ((char *)&result,
                       (ulong)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
LAB_005087e1:
  local_2f8._0_8_ = &local_2e8;
  TVar2 = (TextureFormat)(pTVar21 + 2);
  if (*pTVar21 == TVar2) {
    local_2e8._M_allocated_capacity = *(undefined8 *)TVar2;
    local_2e8._8_8_ = pTVar21[3];
  }
  else {
    local_2e8._M_allocated_capacity = *(undefined8 *)TVar2;
    local_2f8._0_8_ = *pTVar21;
  }
  local_2f8._8_8_ = pTVar21[1];
  *pTVar21 = TVar2;
  pTVar21[1].order = R;
  pTVar21[1].type = SNORM_INT8;
  *(char *)TVar2 = '\0';
  tcu::ScopedLogSection::ScopedLogSection(&iterSection,log,(string *)local_260,(string *)local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._0_8_ != &local_2e8) {
    operator_delete((void *)local_2f8._0_8_,local_2e8._M_allocated_capacity + 1);
  }
  if ((pointer *)
      texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if ((size_t *)result._0_8_ != psVar4) {
    operator_delete((void *)result._0_8_,result.m_pixels.m_cap + 1);
  }
  if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
    operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
  }
  if ((int *)local_348.coordBits.m_data._0_8_ != local_348.uvwBits.m_data + 1) {
    operator_delete((void *)local_348.coordBits.m_data._0_8_,
                    CONCAT44(local_348.uvwBits.m_data[2],local_348.uvwBits.m_data[1]) + 1);
  }
  if ((Vec4 *)fmtInfo.valueMin.m_data._0_8_ != pVVar5) {
    operator_delete((void *)fmtInfo.valueMin.m_data._0_8_,fmtInfo.valueMax.m_data._0_8_ + 1);
  }
  iVar16 = this->m_caseNdx;
  pFVar8 = (this->m_cases).
           super__Vector_base<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  format = &(pFVar8[iVar16].texture)->m_refTexture;
  tcu::getTextureFormatInfo(&fmtInfo,&format->m_format);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_260,TEXTURETYPE_CUBE);
  if ((viewport.width < 0x1c) || (viewport.height < 0x1c)) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Too small render target",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureFilteringTests.cpp"
               ,0x23b);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pFVar8 = pFVar8 + iVar16;
  (**(code **)(lVar19 + 0xb8))(0x8513,pFVar8->texture->m_glTexture);
  (**(code **)(lVar19 + 0x1360))(0x8513,0x2801,this->m_minFilter);
  (**(code **)(lVar19 + 0x1360))(0x8513,0x2800,this->m_magFilter);
  (**(code **)(lVar19 + 0x1360))(0x8513,0x2802,this->m_wrapS);
  (**(code **)(lVar19 + 0x1360))(0x8513,0x2803,this->m_wrapT);
  (**(code **)(lVar19 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  glu::mapGLSampler((Sampler *)local_1c8,0x812f,0x812f,this->m_minFilter,this->m_magFilter);
  local_1fc = local_1a8;
  local_20c = local_1b8;
  pCStack_204 = pCStack_1b0;
  local_260._68_8_ = local_1c8._0_8_;
  pCStack_214 = (ConstPixelBufferAccess *)local_1c8._8_8_;
  uStack_1e7 = (undefined7)(CONCAT44(DStack_190,uStack_194) >> 8);
  local_1e8 = true;
  SVar18 = glu::TextureTestUtil::getSamplerType(format->m_format);
  local_260._4_4_ = SVar18;
  local_260._52_4_ = fmtInfo.lookupBias.m_data[0];
  local_260._56_4_ = fmtInfo.lookupBias.m_data[1];
  local_260._60_4_ = fmtInfo.lookupBias.m_data[2];
  local_260._64_4_ = fmtInfo.lookupBias.m_data[3];
  local_260._36_4_ = fmtInfo.lookupScale.m_data[0];
  local_260._40_4_ = fmtInfo.lookupScale.m_data[1];
  local_260._44_4_ = fmtInfo.lookupScale.m_data[2];
  local_260._48_4_ = fmtInfo.lookupScale.m_data[3];
  local_1e0 = LODMODE_EXACT;
  local_1c8._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  poVar6 = (ostringstream *)(local_1c8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar6);
  local_300 = lVar19;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,"Coordinates: ",0xd);
  tcu::operator<<((ostream *)poVar6,&pFVar8->bottomLeft);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6," -> ",4);
  tcu::operator<<((ostream *)poVar6,&pFVar8->topRight);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar6);
  std::ios_base::~ios_base(local_150);
  face = CUBEFACE_NEGATIVE_X;
  local_308 = &DAT_00aec034;
  do {
    tcu::Surface::Surface(&result,viewport.width,viewport.height);
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    glu::TextureTestUtil::computeQuadTexCoordCube
              (&texCoord,face,&pFVar8->bottomLeft,&pFVar8->topRight);
    local_1c8._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar6 = (ostringstream *)(local_1c8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,"Face ",5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar6,(char *)((long)&DAT_00aec034 + (long)*local_308),2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1c8 + 8));
    std::ios_base::~ios_base(local_150);
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              (&this->m_renderer,0,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(RenderParams *)local_260);
    dVar17 = (**(code **)(local_300 + 0x800))();
    glu::checkError(dVar17,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureFilteringTests.cpp"
                    ,0x25e);
    iVar28 = viewport.y;
    iVar16 = viewport.x;
    context = this->m_renderCtx;
    local_348.coordBits.m_data[0] = 8;
    local_348.coordBits.m_data[1] = 3;
    pvVar27 = (void *)result.m_pixels.m_cap;
    if (result.m_pixels.m_cap != 0) {
      pvVar27 = result.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1c8,(TextureFormat *)&local_348,result.m_width,
               result.m_height,1,pvVar27);
    glu::readPixels(context,iVar16,iVar28,(PixelBufferAccess *)local_1c8);
    dVar17 = (**(code **)(local_300 + 0x800))();
    glu::checkError(dVar17,"Read pixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureFilteringTests.cpp"
                    ,0x261);
    dVar17 = this->m_minFilter;
    dVar7 = this->m_magFilter;
    iVar16 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    uVar26 = (dVar7 == 0x2600 && dVar17 == 0x2600) | 0xfffffffe;
    pixelFormat._0_8_ = *(undefined8 *)(CONCAT44(extraout_var_01,iVar16) + 8);
    pixelFormat._8_8_ = *(undefined8 *)(CONCAT44(extraout_var_01,iVar16) + 0x10);
    colorBits.m_data[0] =
         -(uint)(0 < (int)(uVar26 + pixelFormat.redBits)) & uVar26 + pixelFormat.redBits;
    colorBits.m_data[1] =
         -(uint)(0 < (int)(uVar26 + pixelFormat.greenBits)) & uVar26 + pixelFormat.greenBits;
    colorBits.m_data[2] =
         -(uint)(0 < (int)(uVar26 + pixelFormat.blueBits)) & uVar26 + pixelFormat.blueBits;
    colorBits.m_data[3] =
         -(uint)(0 < (int)(uVar26 + pixelFormat.alphaBits)) & uVar26 + pixelFormat.alphaBits;
    local_314.rule = RULE_OPENGL;
    local_348.coordBits.m_data[0] = 0x16;
    local_348.coordBits.m_data[1] = 0x16;
    local_348.coordBits.m_data[2] = 0x16;
    local_348.uvwBits.m_data[0] = 0x10;
    local_348.uvwBits.m_data[1] = 0x10;
    local_348.uvwBits.m_data[2] = 0x10;
    local_348.colorThreshold.m_data[0] = 0.0;
    local_348.colorThreshold.m_data[1] = 0.0;
    local_348.colorThreshold.m_data[2] = 0.0;
    local_348.colorThreshold.m_data[3] = 0.0;
    local_348.colorMask.m_data[0] = true;
    local_348.colorMask.m_data[1] = true;
    local_348.colorMask.m_data[2] = true;
    local_348.colorMask.m_data[3] = true;
    local_314.derivateBits = 10;
    local_314.lodBits = 5;
    tcu::computeFixedPointThreshold((tcu *)local_1c8,&colorBits);
    auVar14._8_8_ = local_1c8._8_8_;
    auVar14._0_8_ = local_1c8._0_8_;
    auVar13._8_8_ = local_260._44_8_;
    auVar13._0_8_ = local_260._36_8_;
    local_348.colorThreshold.m_data = (float  [4])divps(auVar14,auVar13);
    local_348.coordBits.m_data._0_8_ = (undefined1 *)0xa0000000a;
    local_348.coordBits.m_data[2] = 10;
    local_348.uvwBits.m_data[0] = 6;
    local_348.uvwBits.m_data[1] = 6;
    local_348.uvwBits.m_data[2] = 0;
    auVar29._0_4_ = -(uint)(0 < pixelFormat.redBits);
    auVar29._4_4_ = -(uint)(0 < pixelFormat.greenBits);
    auVar29._8_4_ = -(uint)(0 < pixelFormat.blueBits);
    auVar29._12_4_ = -(uint)(0 < pixelFormat.alphaBits);
    uVar26 = movmskps(extraout_EAX,auVar29);
    bVar22 = (byte)uVar26;
    local_348.colorMask.m_data =
         (bool  [4])
         (uVar26 & 1 | (uint)((bVar22 & 2) >> 1) << 8 | (uint)((bVar22 & 4) >> 2) << 0x10 |
         (uint)(bVar22 >> 3) << 0x18);
    pTVar25 = (this->super_TestCase).super_TestNode.m_testCtx;
    local_1c8._0_8_ = (TestLog *)0x300000008;
    pvVar27 = (void *)result.m_pixels.m_cap;
    if (result.m_pixels.m_cap != 0) {
      pvVar27 = result.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_2f8,(TextureFormat *)local_1c8,result.m_width,
               result.m_height,1,pvVar27);
    pTVar9 = pFVar8->texture;
    pCVar10 = (pTVar9->m_refTexture).m_view.m_levels[5];
    aStack_1a4.uData[3] = (deUint32)pCVar10;
    uStack_194 = (undefined4)((ulong)pCVar10 >> 0x20);
    local_1c8._0_8_ = *(undefined8 *)&(pTVar9->m_refTexture).m_view;
    local_1c8._8_8_ = (pTVar9->m_refTexture).m_view.m_levels[0];
    local_1b8 = (pTVar9->m_refTexture).m_view.m_levels[1];
    pCStack_1b0 = (pTVar9->m_refTexture).m_view.m_levels[2];
    pCVar10 = (pTVar9->m_refTexture).m_view.m_levels[3];
    pCVar12 = (pTVar9->m_refTexture).m_view.m_levels[4];
    local_1a8 = (int)pCVar10;
    aStack_1a4.uData[0] = (deUint32)((ulong)pCVar10 >> 0x20);
    aStack_1a4.uData[1] = (deUint32)pCVar12;
    aStack_1a4.uData[2] = (deUint32)((ulong)pCVar12 >> 0x20);
    bVar15 = glu::TextureTestUtil::verifyTextureResult
                       (pTVar25,(ConstPixelBufferAccess *)local_2f8,(TextureCubeView *)local_1c8,
                        texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,(ReferenceParams *)local_260,&local_348,
                        &local_314,&pixelFormat);
    if (!bVar15) {
      local_314.lodBits = 4;
      local_348.uvwBits.m_data[0] = 4;
      local_348.uvwBits.m_data[1] = 4;
      local_348.uvwBits.m_data[2] = 0;
      local_1c8._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1c8 + 8),
                 "Warning: Verification against high precision requirements failed, trying with lower requirements."
                 ,0x61);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1c8 + 8));
      std::ios_base::~ios_base(local_150);
      pTVar25 = (this->super_TestCase).super_TestNode.m_testCtx;
      local_1c8._0_8_ = (TestLog *)0x300000008;
      pvVar27 = (void *)result.m_pixels.m_cap;
      if (result.m_pixels.m_cap != 0) {
        pvVar27 = result.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_2f8,(TextureFormat *)local_1c8,result.m_width,
                 result.m_height,1,pvVar27);
      pTVar9 = pFVar8->texture;
      pCVar10 = (pTVar9->m_refTexture).m_view.m_levels[5];
      aStack_1a4.uData[3] = (deUint32)pCVar10;
      uStack_194 = (undefined4)((ulong)pCVar10 >> 0x20);
      local_1c8._0_8_ = *(undefined8 *)&(pTVar9->m_refTexture).m_view;
      local_1c8._8_8_ = (pTVar9->m_refTexture).m_view.m_levels[0];
      local_1b8 = (pTVar9->m_refTexture).m_view.m_levels[1];
      pCStack_1b0 = (pTVar9->m_refTexture).m_view.m_levels[2];
      pCVar10 = (pTVar9->m_refTexture).m_view.m_levels[3];
      pCVar12 = (pTVar9->m_refTexture).m_view.m_levels[4];
      local_1a8 = (int)pCVar10;
      aStack_1a4.uData[0] = (deUint32)((ulong)pCVar10 >> 0x20);
      aStack_1a4.uData[1] = (deUint32)pCVar12;
      aStack_1a4.uData[2] = (deUint32)((ulong)pCVar12 >> 0x20);
      bVar15 = glu::TextureTestUtil::verifyTextureResult
                         (pTVar25,(ConstPixelBufferAccess *)local_2f8,(TextureCubeView *)local_1c8,
                          texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,(ReferenceParams *)local_260,&local_348,
                          &local_314,&pixelFormat);
      if (bVar15) {
        pTVar25 = (this->super_TestCase).super_TestNode.m_testCtx;
        if (pTVar25->m_testResult != QP_TEST_RESULT_PASS) goto LAB_0050915f;
        testResult = QP_TEST_RESULT_QUALITY_WARNING;
        description = "Low-quality filtering result";
      }
      else {
        local_1c8._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1c8 + 8),
                   "ERROR: Verification against low precision requirements failed, failing test case."
                   ,0x51);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1c8 + 8));
        std::ios_base::~ios_base(local_150);
        pTVar25 = (this->super_TestCase).super_TestNode.m_testCtx;
        testResult = QP_TEST_RESULT_FAIL;
        description = "Image verification failed";
      }
      tcu::TestContext::setTestResult(pTVar25,testResult,description);
    }
LAB_0050915f:
    if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    tcu::Surface::~Surface(&result);
    face = face + CUBEFACE_POSITIVE_X;
    local_308 = local_308 + 1;
    if (face == CUBEFACE_LAST) {
      iVar16 = this->m_caseNdx + 1;
      this->m_caseNdx = iVar16;
      pFVar8 = (this->m_cases).
               super__Vector_base<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pFVar11 = (this->m_cases).
                super__Vector_base<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      tcu::TestLog::endSection(iterSection.m_log);
      iVar28 = (int)((ulong)((long)pFVar11 - (long)pFVar8) >> 3);
      return (IterateResult)
             (SBORROW4(iVar16,iVar28 * -0x55555555) != iVar16 + iVar28 * 0x55555555 < 0);
    }
  } while( true );
}

Assistant:

TextureCubeFilteringCase::IterateResult TextureCubeFilteringCase::iterate (void)
{
	const glw::Functions&			gl				= m_renderCtx.getFunctions();
	const int						viewportSize	= 28;
	const RandomViewport			viewport		(m_renderCtx.getRenderTarget(), viewportSize, viewportSize, deStringHash(getName()) ^ deInt32Hash(m_caseNdx));
	const tcu::ScopedLogSection		iterSection		(m_testCtx.getLog(), string("Test") + de::toString(m_caseNdx), string("Test ") + de::toString(m_caseNdx));
	const FilterCase&				curCase			= m_cases[m_caseNdx];
	const tcu::TextureFormat&		texFmt			= curCase.texture->getRefTexture().getFormat();
	const tcu::TextureFormatInfo	fmtInfo			= tcu::getTextureFormatInfo(texFmt);
	ReferenceParams					sampleParams	(TEXTURETYPE_CUBE);

	if (viewport.width < viewportSize || viewport.height < viewportSize)
		throw tcu::NotSupportedError("Too small render target", DE_NULL, __FILE__, __LINE__);

	// Setup texture
	gl.bindTexture	(GL_TEXTURE_CUBE_MAP, curCase.texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER,	m_magFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T,		m_wrapT);

	// Other state
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	// Params for reference computation.
	sampleParams.sampler					= glu::mapGLSampler(GL_CLAMP_TO_EDGE, GL_CLAMP_TO_EDGE, m_minFilter, m_magFilter);
	sampleParams.sampler.seamlessCubeMap	= true;
	sampleParams.samplerType				= getSamplerType(texFmt);
	sampleParams.colorBias					= fmtInfo.lookupBias;
	sampleParams.colorScale					= fmtInfo.lookupScale;
	sampleParams.lodMode					= LODMODE_EXACT;

	m_testCtx.getLog() << TestLog::Message << "Coordinates: " << curCase.bottomLeft << " -> " << curCase.topRight << TestLog::EndMessage;

	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		const tcu::CubeFace		face		= tcu::CubeFace(faceNdx);
		tcu::Surface			result		(viewport.width, viewport.height);
		vector<float>			texCoord;

		computeQuadTexCoordCube(texCoord, face, curCase.bottomLeft, curCase.topRight);

		m_testCtx.getLog() << TestLog::Message << "Face " << getFaceDesc(face) << TestLog::EndMessage;

		// \todo Log texture coordinates.

		m_renderer.renderQuad(0, &texCoord[0], sampleParams);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");

		glu::readPixels(m_renderCtx, viewport.x, viewport.y, result.getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels");

		{
			const bool				isNearestOnly	= m_minFilter == GL_NEAREST && m_magFilter == GL_NEAREST;
			const tcu::PixelFormat	pixelFormat		= m_renderCtx.getRenderTarget().getPixelFormat();
			const tcu::IVec4		colorBits		= max(getBitsVec(pixelFormat) - (isNearestOnly ? 1 : 2), tcu::IVec4(0)); // 1 inaccurate bit if nearest only, 2 otherwise
			tcu::LodPrecision		lodPrecision	(tcu::LodPrecision::RULE_OPENGL);
			tcu::LookupPrecision	lookupPrecision;

			lodPrecision.derivateBits		= 10;
			lodPrecision.lodBits			= 5;
			lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(colorBits) / sampleParams.colorScale;
			lookupPrecision.coordBits		= tcu::IVec3(10,10,10);
			lookupPrecision.uvwBits			= tcu::IVec3(6,6,0);
			lookupPrecision.colorMask		= getCompareMask(pixelFormat);

			const bool isHighQuality = verifyTextureResult(m_testCtx, result.getAccess(), curCase.texture->getRefTexture(),
														   &texCoord[0], sampleParams, lookupPrecision, lodPrecision, pixelFormat);

			if (!isHighQuality)
			{
				// Evaluate against lower precision requirements.
				lodPrecision.lodBits	= 4;
				lookupPrecision.uvwBits	= tcu::IVec3(4,4,0);

				m_testCtx.getLog() << TestLog::Message << "Warning: Verification against high precision requirements failed, trying with lower requirements." << TestLog::EndMessage;

				const bool isOk = verifyTextureResult(m_testCtx, result.getAccess(), curCase.texture->getRefTexture(),
													  &texCoord[0], sampleParams, lookupPrecision, lodPrecision, pixelFormat);

				if (!isOk)
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
				}
				else if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Low-quality filtering result");
			}
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? CONTINUE : STOP;
}